

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O1

void __thiscall
Catch::Capturer::Capturer
          (Capturer *this,StringRef macroName,SourceLineInfo *lineInfo,OfType resultType,
          StringRef names)

{
  Capturer *pCVar1;
  int iVar2;
  IResultCapture *pIVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  byte bVar7;
  ulong uVar8;
  byte *pbVar9;
  ulong uVar10;
  bool bVar11;
  stack<char,_std::deque<char,_std::allocator<char>_>_> openings;
  byte local_ed;
  OfType local_ec;
  Capturer *local_e8;
  SourceLineInfo *local_e0;
  string local_d8;
  StringRef local_b8;
  _Deque_base<char,_std::allocator<char>_> local_a8;
  ReusableStringStream local_58;
  SourceLineInfo local_40;
  
  local_b8.m_size = macroName.m_size;
  local_b8.m_start = macroName.m_start;
  (this->m_messages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_messages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_messages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_ec = resultType;
  local_e8 = this;
  local_e0 = lineInfo;
  pIVar3 = getResultCapture();
  this->m_resultCapture = pIVar3;
  this->m_captured = 0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_a8._M_impl.super__Deque_impl_data._M_map_size = 0;
  clara::std::_Deque_base<char,_std::allocator<char>_>::_M_initialize_map(&local_a8,0);
  if (names.m_size == 0) {
    uVar8 = 0;
  }
  else {
    uVar10 = 0;
    uVar8 = 0;
    do {
      local_ed = names.m_start[uVar10];
      if (local_ed < 0x5b) {
        switch(local_ed) {
        case 0x22:
        case 0x27:
          uVar4 = uVar10 + 1;
          if (names.m_size <= uVar4) {
LAB_00122768:
            ReusableStringStream::ReusableStringStream(&local_58);
            local_40.file =
                 "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2/include/catch2/catch.2.13.10.hpp"
            ;
            local_40.line = 0x2e6b;
            operator<<(local_58.m_oss,&local_40);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_58.m_oss,": Internal Catch2 error: ",0x19);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_58.m_oss,"CAPTURE parsing encountered unmatched quote",0x2b)
            ;
            std::__cxx11::stringbuf::str();
            throw_logic_error(&local_d8);
          }
          bVar11 = true;
          bVar7 = names.m_start[uVar4];
          while (bVar7 != local_ed) {
            uVar5 = uVar4;
            if (bVar7 == 0x5c) {
              uVar5 = uVar10 + 2;
            }
            uVar4 = uVar5 + 1;
            bVar11 = uVar4 < names.m_size;
            if (!bVar11) goto LAB_00122768;
            uVar10 = uVar5;
            bVar7 = names.m_start[uVar4];
          }
          uVar10 = uVar4;
          if (!bVar11) goto LAB_00122768;
          break;
        case 0x28:
          goto switchD_0012244c_caseD_28;
        case 0x29:
          goto switchD_0012244c_caseD_29;
        case 0x2c:
          if ((uVar8 != uVar10) &&
             (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_a8._M_impl.super__Deque_impl_data._M_start._M_cur)) {
            std::vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>>::
            emplace_back<Catch::StringRef&,Catch::SourceLineInfo_const&,Catch::ResultWas::OfType&>
                      ((vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>> *)this,
                       &local_b8,local_e0,&local_ec);
            uVar4 = (uVar10 - uVar8) + 1;
            while (((byte)names.m_start[uVar8] == 0x2c ||
                   (iVar2 = isspace((uint)(byte)names.m_start[uVar8]), iVar2 != 0))) {
              uVar8 = uVar8 + 1;
              uVar4 = uVar4 - 1;
            }
            pbVar9 = (byte *)(names.m_start + uVar10);
            while ((*pbVar9 == 0x2c || (iVar2 = isspace((uint)*pbVar9), iVar2 != 0))) {
              uVar4 = uVar4 - 1;
              pbVar9 = pbVar9 + -1;
            }
            pcVar6 = names.m_start + uVar8;
            uVar5 = names.m_size - uVar8;
            if (names.m_size < uVar8 || uVar5 == 0) {
              pcVar6 = "";
            }
            if (uVar4 <= uVar5) {
              uVar5 = uVar4;
            }
            if (names.m_size <= uVar8) {
              uVar5 = 0;
            }
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_d8,pcVar6,pcVar6 + uVar5);
            this = local_e8;
            std::__cxx11::string::operator=
                      ((string *)
                       &(local_e8->m_messages).
                        super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1].message,(string *)&local_d8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p);
            }
            std::__cxx11::string::append
                      ((char *)&(this->m_messages).
                                super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
                                ._M_impl.super__Vector_impl_data._M_finish[-1].message);
            uVar8 = uVar10;
          }
        }
      }
      else {
        if (local_ed < 0x7b) {
          if (local_ed != 0x5b) {
            if (local_ed != 0x5d) goto switchD_0012244c_caseD_23;
switchD_0012244c_caseD_29:
            if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_a8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              operator_delete(local_a8._M_impl.super__Deque_impl_data._M_finish._M_first);
              local_a8._M_impl.super__Deque_impl_data._M_finish._M_first =
                   local_a8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
              local_a8._M_impl.super__Deque_impl_data._M_finish._M_last =
                   (_Elt_pointer)
                   ((byte *)local_a8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x200);
              local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   (_Elt_pointer)
                   ((byte *)local_a8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1ff);
              local_a8._M_impl.super__Deque_impl_data._M_finish._M_node =
                   local_a8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            }
            else {
              local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
            goto switchD_0012244c_caseD_23;
          }
        }
        else {
          if (local_ed == 0x7d) goto switchD_0012244c_caseD_29;
          if (local_ed != 0x7b) goto switchD_0012244c_caseD_23;
        }
switchD_0012244c_caseD_28:
        if (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_a8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<char,std::allocator<char>>::_M_push_back_aux<char_const&>
                    ((deque<char,std::allocator<char>> *)&local_a8,(char *)&local_ed);
        }
        else {
          *local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_ed;
          local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
      }
switchD_0012244c_caseD_23:
      uVar10 = uVar10 + 1;
    } while (uVar10 < names.m_size);
  }
  std::vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>>::
  emplace_back<Catch::StringRef&,Catch::SourceLineInfo_const&,Catch::ResultWas::OfType&>
            ((vector<Catch::MessageInfo,std::allocator<Catch::MessageInfo>> *)this,&local_b8,
             local_e0,&local_ec);
  while (((byte)names.m_start[uVar8] == 0x2c ||
         (iVar2 = isspace((uint)(byte)names.m_start[uVar8]), iVar2 != 0))) {
    uVar8 = uVar8 + 1;
  }
  pbVar9 = (byte *)(names.m_start + names.m_size);
  uVar10 = names.m_size - uVar8;
  while( true ) {
    pbVar9 = pbVar9 + -1;
    if ((*pbVar9 != 0x2c) && (iVar2 = isspace((uint)*pbVar9), iVar2 == 0)) break;
    uVar10 = uVar10 - 1;
  }
  uVar4 = names.m_size - uVar8;
  pcVar6 = "";
  if (uVar8 <= names.m_size && uVar4 != 0) {
    pcVar6 = names.m_start + uVar8;
  }
  if (uVar10 <= uVar4) {
    uVar4 = uVar10;
  }
  uVar10 = 0;
  if (uVar8 < names.m_size) {
    uVar10 = uVar4;
  }
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,pcVar6,pcVar6 + uVar10);
  pCVar1 = local_e8;
  std::__cxx11::string::operator=
            ((string *)
             &(local_e8->m_messages).
              super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].message,(string *)&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  std::__cxx11::string::append
            ((char *)&(pCVar1->m_messages).
                      super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].message);
  clara::std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base(&local_a8);
  return;
}

Assistant:

Capturer::Capturer( StringRef macroName, SourceLineInfo const& lineInfo, ResultWas::OfType resultType, StringRef names ) {
        auto trimmed = [&] (size_t start, size_t end) {
            while (names[start] == ',' || isspace(static_cast<unsigned char>(names[start]))) {
                ++start;
            }
            while (names[end] == ',' || isspace(static_cast<unsigned char>(names[end]))) {
                --end;
            }
            return names.substr(start, end - start + 1);
        };
        auto skipq = [&] (size_t start, char quote) {
            for (auto i = start + 1; i < names.size() ; ++i) {
                if (names[i] == quote)
                    return i;
                if (names[i] == '\\')
                    ++i;
            }
            CATCH_INTERNAL_ERROR("CAPTURE parsing encountered unmatched quote");
        };

        size_t start = 0;
        std::stack<char> openings;
        for (size_t pos = 0; pos < names.size(); ++pos) {
            char c = names[pos];
            switch (c) {
            case '[':
            case '{':
            case '(':
            // It is basically impossible to disambiguate between
            // comparison and start of template args in this context
//            case '<':
                openings.push(c);
                break;
            case ']':
            case '}':
            case ')':
//           case '>':
                openings.pop();
                break;
            case '"':
            case '\'':
                pos = skipq(pos, c);
                break;
            case ',':
                if (start != pos && openings.empty()) {
                    m_messages.emplace_back(macroName, lineInfo, resultType);
                    m_messages.back().message = static_cast<std::string>(trimmed(start, pos));
                    m_messages.back().message += " := ";
                    start = pos;
                }
            }
        }
        assert(openings.empty() && "Mismatched openings");
        m_messages.emplace_back(macroName, lineInfo, resultType);
        m_messages.back().message = static_cast<std::string>(trimmed(start, names.size() - 1));
        m_messages.back().message += " := ";
    }